

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_iso9660_empty.c
# Opt level: O0

void test_write_format_iso9660_empty(void)

{
  int iVar1;
  mode_t mVar2;
  time_t tVar3;
  time_t tVar4;
  char *v2;
  la_int64_t v2_00;
  uint local_34;
  size_t sStack_30;
  uint i;
  size_t used;
  size_t buffsize;
  uchar *buff;
  archive_entry *ae;
  archive *a;
  
  used = 0x5f000;
  buffsize = (size_t)malloc(0x5f000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                   ,L'<',(uint)((void *)buffsize != (void *)0x0),"buff != NULL",(void *)0x0);
  if (buffsize != 0) {
    ae = (archive_entry *)archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                     ,L'A',(uint)(ae != (archive_entry *)0x0),"(a = archive_write_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_write_set_format_iso9660((archive *)ae);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                     ,L'B',(uint)(iVar1 == 0),"0 == archive_write_set_format_iso9660(a)",ae);
    iVar1 = archive_write_add_filter_none((archive *)ae);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                     ,L'C',(uint)(iVar1 == 0),"0 == archive_write_add_filter_none(a)",ae);
    iVar1 = archive_write_set_bytes_per_block((archive *)ae,1);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                     ,L'D',(uint)(iVar1 == 0),"0 == archive_write_set_bytes_per_block(a, 1)",ae);
    iVar1 = archive_write_set_bytes_in_last_block((archive *)ae,1);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                     ,L'E',(uint)(iVar1 == 0),"0 == archive_write_set_bytes_in_last_block(a, 1)",ae)
    ;
    iVar1 = archive_write_open_memory((archive *)ae,(void *)buffsize,used,&stack0xffffffffffffffd0);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                     ,L'F',(uint)(iVar1 == 0),
                     "0 == archive_write_open_memory(a, buff, buffsize, &used)",ae);
    buff = (uchar *)archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                     ,L'I',(uint)((archive_entry *)buff != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_atime((archive_entry *)buff,2,0);
    archive_entry_set_ctime((archive_entry *)buff,4,0);
    archive_entry_set_mtime((archive_entry *)buff,5,0);
    archive_entry_copy_pathname((archive_entry *)buff,".");
    archive_entry_set_mode((archive_entry *)buff,0x41ed);
    iVar1 = archive_write_header((archive *)ae,(archive_entry *)buff);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                        ,L'O',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",ae);
    archive_entry_free((archive_entry *)buff);
    buff = (uchar *)archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                     ,L'S',(uint)((archive_entry *)buff != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_atime((archive_entry *)buff,2,0);
    archive_entry_set_ctime((archive_entry *)buff,4,0);
    archive_entry_set_mtime((archive_entry *)buff,5,0);
    archive_entry_copy_pathname((archive_entry *)buff,"..");
    archive_entry_set_mode((archive_entry *)buff,0x41ed);
    iVar1 = archive_write_header((archive *)ae,(archive_entry *)buff);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                        ,L'Y',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",ae);
    archive_entry_free((archive_entry *)buff);
    buff = (uchar *)archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                     ,L']',(uint)((archive_entry *)buff != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_atime((archive_entry *)buff,2,0);
    archive_entry_set_ctime((archive_entry *)buff,4,0);
    archive_entry_set_mtime((archive_entry *)buff,5,0);
    archive_entry_copy_pathname((archive_entry *)buff,"/");
    archive_entry_set_mode((archive_entry *)buff,0x41ed);
    iVar1 = archive_write_header((archive *)ae,(archive_entry *)buff);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                        ,L'c',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",ae);
    archive_entry_free((archive_entry *)buff);
    buff = (uchar *)archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                     ,L'g',(uint)((archive_entry *)buff != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_atime((archive_entry *)buff,2,0);
    archive_entry_set_ctime((archive_entry *)buff,4,0);
    archive_entry_set_mtime((archive_entry *)buff,5,0);
    archive_entry_copy_pathname((archive_entry *)buff,"../");
    archive_entry_set_mode((archive_entry *)buff,0x41ed);
    iVar1 = archive_write_header((archive *)ae,(archive_entry *)buff);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                        ,L'm',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",ae);
    archive_entry_free((archive_entry *)buff);
    buff = (uchar *)archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                     ,L'q',(uint)((archive_entry *)buff != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_atime((archive_entry *)buff,2,0);
    archive_entry_set_ctime((archive_entry *)buff,4,0);
    archive_entry_set_mtime((archive_entry *)buff,5,0);
    archive_entry_copy_pathname((archive_entry *)buff,"../../.");
    archive_entry_set_mode((archive_entry *)buff,0x41ed);
    iVar1 = archive_write_header((archive *)ae,(archive_entry *)buff);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                        ,L'w',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",ae);
    archive_entry_free((archive_entry *)buff);
    buff = (uchar *)archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                     ,L'{',(uint)((archive_entry *)buff != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_atime((archive_entry *)buff,2,0);
    archive_entry_set_ctime((archive_entry *)buff,4,0);
    archive_entry_set_mtime((archive_entry *)buff,5,0);
    archive_entry_copy_pathname((archive_entry *)buff,"..//.././");
    archive_entry_set_mode((archive_entry *)buff,0x41ed);
    iVar1 = archive_write_header((archive *)ae,(archive_entry *)buff);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                        ,L'\x81',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",ae);
    archive_entry_free((archive_entry *)buff);
    iVar1 = archive_write_close((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                        ,L'\x85',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",ae);
    iVar1 = archive_write_free((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                        ,L'\x86',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",ae);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                     ,L'\x88',(uint)(sStack_30 == 0x5a800),"used == 2048 * 181",(void *)0x0);
    for (local_34 = 0; local_34 < 0x8000; local_34 = local_34 + 1) {
      failure("System Area should be all nulls.");
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                       ,L'\x8c',(uint)(*(char *)(buffsize + local_34) == '\0'),"buff[i] == 0",
                       (void *)0x0);
    }
    failure("Primary Volume Descriptor should be in 16 Logical Sector.");
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                        ,L'\x91',(void *)(buffsize + 0x8000),"buff+2048*16","\x01CD001\x01",
                        "primary_id",8,"8",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                        ,L'\x93',(void *)(buffsize + 0x8028),"buff+2048*16+0x28",
                        "CDROM                           ","\"CDROM                           \"",
                        0x20,"32",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                        ,L'\x94',(void *)(buffsize + 0x8050),"buff+2048*16+0x50",volumesize,
                        "volumesize",8,"8",(void *)0x0);
    failure("Supplementary Volume(Joliet) Descriptor should be in 17 Logical Sector.");
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                        ,L'\x99',(void *)(buffsize + 0x8800),"buff+2048*17","\x02CD001\x01",
                        "supplementary_id",8,"8",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                        ,L'\x9a',(void *)(buffsize + 0x8828),"buff+2048*17+0x28","","volumeidu16",
                        0x20,"32",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                        ,L'\x9b',(void *)(buffsize + 0x8850),"buff+2048*17+0x50",volumesize,
                        "volumesize",8,"8",(void *)0x0);
    failure(
           "Date and Time of Primary Volume and Date and Time of Supplementary Volume must be the same."
           );
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                        ,L'\x9f',(void *)(buffsize + 0x832d),"buff+2048*16+0x32d",
                        (void *)(buffsize + 0x8b2d),"buff+2048*17+0x32d",0x44,"0x44",(void *)0x0);
    failure("Volume Descriptor Set Terminator should be in 18 Logical Sector.");
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                        ,L'¤',(void *)(buffsize + 0x9000),"buff+2048*18",terminator_id,
                        "terminator_id",8,"8",(void *)0x0);
    for (local_34 = 8; local_34 < 0x800; local_34 = local_34 + 1) {
      failure("Body of Volume Descriptor Set Terminator should be all nulls.");
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                       ,L'¨',(uint)(*(char *)(buffsize + (local_34 + 0x9000)) == '\0'),
                       "buff[2048*18+i] == 0",(void *)0x0);
    }
    for (local_34 = 0; local_34 < 0x4b000; local_34 = local_34 + 1) {
      failure("Padding data should be all nulls.");
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                       ,L'®',(uint)(*(char *)(buffsize + (local_34 + 0xf800)) == '\0'),
                       "buff[2048*31+i] == 0",(void *)0x0);
    }
    ae = (archive_entry *)archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                     ,L'´',(uint)(ae != (archive_entry *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar1 = archive_read_support_format_all((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                        ,L'µ',0,"0",(long)iVar1,"archive_read_support_format_all(a)",ae);
    iVar1 = archive_read_support_filter_all((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                        ,L'¶',0,"0",(long)iVar1,"archive_read_support_filter_all(a)",ae);
    iVar1 = archive_read_open_memory((archive *)ae,(void *)buffsize,sStack_30);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                        ,L'·',0,"0",(long)iVar1,"archive_read_open_memory(a, buff, used)",ae);
    iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&buff);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                        ,L'½',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
    tVar3 = archive_entry_atime((archive_entry *)buff);
    tVar4 = archive_entry_ctime((archive_entry *)buff);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                        ,L'¾',tVar3,"archive_entry_atime(ae)",tVar4,"archive_entry_ctime(ae)",
                        (void *)0x0);
    tVar3 = archive_entry_atime((archive_entry *)buff);
    tVar4 = archive_entry_mtime((archive_entry *)buff);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                        ,L'¿',tVar3,"archive_entry_atime(ae)",tVar4,"archive_entry_mtime(ae)",
                        (void *)0x0);
    v2 = archive_entry_pathname((archive_entry *)buff);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
               ,L'À',".","\".\"",v2,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    mVar2 = archive_entry_mode((archive_entry *)buff);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                     ,L'Á',(uint)(mVar2 == 0x416d),"(S_IFDIR | 0555) == archive_entry_mode(ae)",
                     (void *)0x0);
    v2_00 = archive_entry_size((archive_entry *)buff);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                        ,L'Â',0x800,"2048",v2_00,"archive_entry_size(ae)",(void *)0x0);
    iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&buff);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                        ,L'Ç',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
    iVar1 = archive_read_close((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                        ,L'È',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",ae);
    iVar1 = archive_read_free((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_iso9660_empty.c"
                        ,L'É',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",ae);
    free((void *)buffsize);
  }
  return;
}

Assistant:

DEFINE_TEST(test_write_format_iso9660_empty)
{
	struct archive *a;
	struct archive_entry *ae;
	unsigned char *buff;
	size_t buffsize = 190 * 2048;
	size_t used;
	unsigned int i;

	buff = malloc(buffsize);
	assert(buff != NULL);
	if (buff == NULL)
		return;

	/* ISO9660 format: Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_iso9660(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_set_bytes_per_block(a, 1));
	assertA(0 == archive_write_set_bytes_in_last_block(a, 1));
	assertA(0 == archive_write_open_memory(a, buff, buffsize, &used));

	/* Add "." entry which must be ignored. */ 
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 0);
	archive_entry_set_ctime(ae, 4, 0);
	archive_entry_set_mtime(ae, 5, 0);
	archive_entry_copy_pathname(ae, ".");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Add ".." entry which must be ignored. */ 
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 0);
	archive_entry_set_ctime(ae, 4, 0);
	archive_entry_set_mtime(ae, 5, 0);
	archive_entry_copy_pathname(ae, "..");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Add "/" entry which must be ignored. */ 
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 0);
	archive_entry_set_ctime(ae, 4, 0);
	archive_entry_set_mtime(ae, 5, 0);
	archive_entry_copy_pathname(ae, "/");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Add "../" entry which must be ignored. */ 
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 0);
	archive_entry_set_ctime(ae, 4, 0);
	archive_entry_set_mtime(ae, 5, 0);
	archive_entry_copy_pathname(ae, "../");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Add "../../." entry which must be ignored. */ 
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 0);
	archive_entry_set_ctime(ae, 4, 0);
	archive_entry_set_mtime(ae, 5, 0);
	archive_entry_copy_pathname(ae, "../../.");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Add "..//.././" entry which must be ignored. */ 
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_atime(ae, 2, 0);
	archive_entry_set_ctime(ae, 4, 0);
	archive_entry_set_mtime(ae, 5, 0);
	archive_entry_copy_pathname(ae, "..//.././");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_free(a));

	assert(used == 2048 * 181);
	/* Check System Area. */
	for (i = 0; i < 2048 * 16; i++) {
		failure("System Area should be all nulls.");
		assert(buff[i] == 0);
	}

	/* Primary Volume. */
	failure("Primary Volume Descriptor should be in 16 Logical Sector.");
	assertEqualMem(buff+2048*16, primary_id, 8);
	assertEqualMem(buff+2048*16+0x28,
	    "CDROM                           ", 32);
	assertEqualMem(buff+2048*16+0x50, volumesize, 8);

	/* Supplementary Volume. */
	failure("Supplementary Volume(Joliet) Descriptor "
	    "should be in 17 Logical Sector.");
	assertEqualMem(buff+2048*17, supplementary_id, 8);
	assertEqualMem(buff+2048*17+0x28, volumeidu16, 32);
	assertEqualMem(buff+2048*17+0x50, volumesize, 8);
	failure("Date and Time of Primary Volume and "
	    "Date and Time of Supplementary Volume "
	    "must be the same.");
	assertEqualMem(buff+2048*16+0x32d, buff+2048*17+0x32d, 0x44);

	/* Terminator. */
	failure("Volume Descriptor Set Terminator "
	    "should be in 18 Logical Sector.");
	assertEqualMem(buff+2048*18, terminator_id, 8);
	for (i = 8; i < 2048; i++) {
		failure("Body of Volume Descriptor Set Terminator "
		    "should be all nulls.");
		assert(buff[2048*18+i] == 0);
	}

	/* Padding data. */
	for (i = 0; i < 2048*150; i++) {
		failure("Padding data should be all nulls.");
		assert(buff[2048*31+i] == 0);
	}

	/*
	 * Read ISO image.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, 0, archive_read_support_format_all(a));
	assertEqualIntA(a, 0, archive_read_support_filter_all(a));
	assertEqualIntA(a, 0, archive_read_open_memory(a, buff, used));

	/*
	 * Read Root Directory
	 * Root Directory entry must be in ISO image.
	 */
	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualInt(archive_entry_atime(ae), archive_entry_ctime(ae));
	assertEqualInt(archive_entry_atime(ae), archive_entry_mtime(ae));
	assertEqualString(".", archive_entry_pathname(ae));
	assert((S_IFDIR | 0555) == archive_entry_mode(ae));
	assertEqualInt(2048, archive_entry_size(ae));

	/*
	 * Verify the end of the archive.
	 */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));

	free(buff);
}